

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

void Gia_ObjComputeTruthTable6Lut_rec(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTemp)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  long lVar3;
  word *pwVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[(uint)iObj] == p->nTravIds) {
    return;
  }
  pGVar8 = p->pObjs + (uint)iObj;
  p->pTravIds[(uint)iObj] = p->nTravIds;
  uVar7 = (uint)*(long *)pGVar8;
  if (((int)uVar7 < 0) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x12d,"void Gia_ObjComputeTruthTable6Lut_rec(Gia_Man_t *, int, Vec_Wrd_t *)");
  }
  if (iObj < p->nObjs) {
    Gia_ObjComputeTruthTable6Lut_rec(p,iObj - (uVar7 & 0x1fffffff),vTemp);
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pGVar8) && (pGVar8 < pGVar2 + p->nObjs)) {
      Gia_ObjComputeTruthTable6Lut_rec
                (p,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555 -
                   (*(uint *)&pGVar8->field_0x4 & 0x1fffffff),vTemp);
      pGVar2 = p->pObjs;
      if ((pGVar2 <= pGVar8) && (pGVar8 < pGVar2 + p->nObjs)) {
        iVar5 = (int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555;
        lVar3 = *(long *)pGVar8;
        uVar7 = iVar5 - ((uint)lVar3 & 0x1fffffff);
        if ((((-1 < (int)uVar7) && (uVar1 = vTemp->nSize, (int)uVar7 < (int)uVar1)) &&
            (uVar6 = iVar5 - ((uint)((ulong)lVar3 >> 0x20) & 0x1fffffff), -1 < (int)uVar6)) &&
           (uVar6 < uVar1)) {
          if ((uint)iObj < uVar1) {
            pwVar4 = vTemp->pArray;
            pwVar4[(uint)iObj] =
                 ((lVar3 << 2) >> 0x3f ^ pwVar4[uVar6]) &
                 ((long)((int)((uint)lVar3 * 4) >> 0x1f) ^ pwVar4[uVar7]);
            return;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ObjComputeTruthTable6Lut_rec( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTemp )
{
    word uTruth0, uTruth1;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjComputeTruthTable6Lut_rec( p, Gia_ObjFaninId0p(p, pObj), vTemp );
    Gia_ObjComputeTruthTable6Lut_rec( p, Gia_ObjFaninId1p(p, pObj), vTemp );
    uTruth0 = Vec_WrdEntry( vTemp, Gia_ObjFaninId0p(p, pObj) );
    uTruth0 = Gia_ObjFaninC0(pObj) ? ~uTruth0 : uTruth0;
    uTruth1 = Vec_WrdEntry( vTemp, Gia_ObjFaninId1p(p, pObj) );
    uTruth1 = Gia_ObjFaninC1(pObj) ? ~uTruth1 : uTruth1;
    Vec_WrdWriteEntry( vTemp, iObj, uTruth0 & uTruth1 );
}